

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O3

CharCount __thiscall
UnifiedRegex::AltNode::TransferPass0(AltNode *this,Compiler *compiler,Char *litbuf)

{
  AltNode **ppAVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  undefined4 *puVar6;
  AltNode *pAVar7;
  uint uVar8;
  
  ThreadContext::ProbeStackNoDispose
            (compiler->scriptContext->threadContext,0x6000,compiler->scriptContext,(PVOID)0x0);
  if (this->tail == (AltNode *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                       ,0x855,"(tail != 0)","tail != 0");
    if (!bVar3) {
LAB_00e99f7b:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  else {
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  }
  uVar8 = 0;
  pAVar7 = (AltNode *)0x0;
  do {
    if (this->head->tag == Alt) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0x85c,"(curr->head->tag != Alt)","curr->head->tag != Alt");
      if (!bVar3) goto LAB_00e99f7b;
      *puVar6 = 0;
    }
    if (pAVar7 != (AltNode *)0x0) {
      iVar4 = (*pAVar7->head->_vptr_Node[2])();
      if ((char)iVar4 != '\0') {
        iVar4 = (*this->head->_vptr_Node[2])();
        if ((char)iVar4 != '\0') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                             ,0x85d,
                             "(prev == 0 || !(prev->head->IsCharOrPositiveSet() && curr->head->IsCharOrPositiveSet()))"
                             ,
                             "prev == 0 || !(prev->head->IsCharOrPositiveSet() && curr->head->IsCharOrPositiveSet())"
                            );
          if (!bVar3) goto LAB_00e99f7b;
          *puVar6 = 0;
        }
      }
    }
    uVar5 = (*this->head->_vptr_Node[3])(this->head,compiler,litbuf);
    bVar3 = CARRY4(uVar8,uVar5);
    uVar8 = uVar8 + uVar5;
    if (bVar3) {
      Math::DefaultOverflowPolicy();
    }
    ppAVar1 = &this->tail;
    pAVar7 = this;
    this = *ppAVar1;
    if (*ppAVar1 == (AltNode *)0x0) {
      return uVar8;
    }
  } while( true );
}

Assistant:

CharCount AltNode::TransferPass0(Compiler& compiler, const Char* litbuf)
    {
        PROBE_STACK_NO_DISPOSE(compiler.scriptContext, Js::Constants::MinStackRegex);

        Assert(tail != 0);
        CharCount n = 0;
#if DBG
        AltNode* prev = 0;
#endif
        for (AltNode* curr = this; curr != 0; curr = curr->tail)
        {
            Assert(curr->head->tag != Alt);
            Assert(prev == 0 || !(prev->head->IsCharOrPositiveSet() && curr->head->IsCharOrPositiveSet()));
            n = UInt32Math::Add(n, curr->head->TransferPass0(compiler, litbuf));
#if DBG
            prev = curr;
#endif
        }
        return n;
    }